

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGValidateAttributeList
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict defines)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  xmlRelaxNGDefinePtr define;
  
  if (defines == (xmlRelaxNGDefinePtr_conflict)0x0) {
    bVar1 = true;
    uVar3 = 0;
  }
  else {
    bVar1 = false;
    uVar3 = 0;
    define = defines;
    do {
      if (define->type == XML_RELAXNG_ATTRIBUTE) {
        iVar2 = xmlRelaxNGValidateAttribute(ctxt,define);
        uVar3 = uVar3 | -(uint)(iVar2 != 0);
      }
      else {
        bVar1 = true;
      }
      define = define->next;
    } while (define != (xmlRelaxNGDefinePtr)0x0);
    bVar1 = !bVar1;
  }
  if (defines != (xmlRelaxNGDefinePtr_conflict)0x0 && !bVar1) {
    do {
      if (defines->type != XML_RELAXNG_ATTRIBUTE) {
        if ((ctxt->state == (xmlRelaxNGValidStatePtr)0x0) &&
           (ctxt->states == (xmlRelaxNGStatesPtr)0x0)) {
          xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOSTATE,(xmlChar *)0x0,(xmlChar *)0x0,0);
          return -1;
        }
        iVar2 = xmlRelaxNGValidateDefinition(ctxt,defines);
        if (iVar2 < 0) {
          uVar3 = 0xffffffff;
        }
        if (iVar2 == -1) {
          return uVar3;
        }
      }
      defines = defines->next;
    } while (defines != (xmlRelaxNGDefinePtr)0x0);
  }
  return uVar3;
}

Assistant:

static int
xmlRelaxNGValidateAttributeList(xmlRelaxNGValidCtxtPtr ctxt,
                                xmlRelaxNGDefinePtr defines)
{
    int ret = 0, res;
    int needmore = 0;
    xmlRelaxNGDefinePtr cur;

    cur = defines;
    while (cur != NULL) {
        if (cur->type == XML_RELAXNG_ATTRIBUTE) {
            if (xmlRelaxNGValidateAttribute(ctxt, cur) != 0)
                ret = -1;
        } else
            needmore = 1;
        cur = cur->next;
    }
    if (!needmore)
        return (ret);
    cur = defines;
    while (cur != NULL) {
        if (cur->type != XML_RELAXNG_ATTRIBUTE) {
            if ((ctxt->state != NULL) || (ctxt->states != NULL)) {
                res = xmlRelaxNGValidateDefinition(ctxt, cur);
                if (res < 0)
                    ret = -1;
            } else {
                VALID_ERR(XML_RELAXNG_ERR_NOSTATE);
                return (-1);
            }
            if (res == -1)      /* continues on -2 */
                break;
        }
        cur = cur->next;
    }

    return (ret);
}